

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O3

int Smt_PrsBuildNode(Wlc_Ntk_t *pNtk,Smt_Prs_t *p,int iNode,int RangeOut,char *pName)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Wlc_Obj_t *pWVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int Id;
  int iVar13;
  char Buffer [10];
  uint local_58;
  int local_54;
  char *local_50;
  undefined8 local_48;
  int local_3c [3];
  
  local_50 = pName;
  if (iNode < 0) {
LAB_002fc513:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10d,"int Abc_LitIsCompl(int)");
  }
  if ((iNode & 1U) == 0) {
    do {
      uVar9 = (uint)iNode >> 1;
      if ((p->vObjs).nSize <= (int)uVar9) goto LAB_002fc551;
      pVVar1 = (p->vObjs).pArray;
      iVar2 = pVVar1[uVar9].nSize;
      if (iVar2 < 1) goto LAB_002fc532;
      uVar12 = *pVVar1[uVar9].pArray;
      if ((int)uVar12 < 0) goto LAB_002fc513;
      if ((uVar12 & 1) == 0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
        iVar2 = pVVar1[uVar9].nSize;
      }
      if (iVar2 < 2) goto LAB_002fc532;
      uVar12 = pVVar1[uVar9].pArray[1];
      if ((int)uVar12 < 0) goto LAB_002fc513;
      if ((uVar12 & 1) == 0) {
        if (pcVar5 != (char *)0x0) goto LAB_002fbfc5;
LAB_002fc0ad:
        uVar12 = *pVVar1[uVar9].pArray;
        if ((int)uVar12 < 0) goto LAB_002fc513;
        if ((uVar12 & 1) == 0) {
          uVar12 = uVar12 >> 1;
          if ((p->vObjs).nSize <= (int)uVar12) {
LAB_002fc551:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          pVVar6 = (p->vObjs).pArray;
          iVar2 = pVVar6[uVar12].nSize;
          if (iVar2 < 1) goto LAB_002fc532;
          uVar3 = *pVVar6[uVar12].pArray;
          if ((int)uVar3 < 0) goto LAB_002fc513;
          if ((uVar3 & 1) == 0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar5 = Abc_NamStr(p->pStrs,uVar3 >> 1);
            iVar2 = pVVar6[uVar12].nSize;
          }
          if (iVar2 < 3) {
            __assert_fail("Vec_IntSize(vFans) >= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                          ,0xe9,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
          }
          if ((*pcVar5 != '_') || (pcVar5[1] != '\0')) {
            __assert_fail("!strcmp(pStr, \"_\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                          ,0xea,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
          }
          uVar3 = pVVar6[uVar12].pArray[1];
          if ((int)uVar3 < 0) goto LAB_002fc513;
          if ((uVar3 & 1) == 0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar5 = Abc_NamStr(p->pStrs,uVar3 >> 1);
          }
          iVar2 = Smt_StrToType(pcVar5,&local_54);
          local_48 = CONCAT44(extraout_var_00,iVar2);
          iVar2 = pVVar6[uVar12].nSize;
          if (iVar2 < 3) goto LAB_002fc532;
          uVar3 = pVVar6[uVar12].pArray[2];
          if ((int)uVar3 < 0) goto LAB_002fc513;
          if ((uVar3 & 1) == 0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar5 = Abc_NamStr(p->pStrs,uVar3 >> 1);
            iVar2 = pVVar6[uVar12].nSize;
          }
          uVar3 = atoi(pcVar5);
          local_58 = 0xffffffff;
          if (3 < iVar2) {
            uVar12 = pVVar6[uVar12].pArray[3];
            if ((int)uVar12 < 0) goto LAB_002fc513;
            if ((uVar12 & 1) == 0) {
              pcVar5 = (char *)0x0;
            }
            else {
              pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
            }
            local_58 = atoi(pcVar5);
          }
        }
        else {
          pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
          iVar2 = Smt_StrToType(pcVar5,&local_54);
          local_48 = CONCAT44(extraout_var,iVar2);
          uVar3 = 0xffffffff;
          local_58 = 0xffffffff;
        }
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 100;
        pVVar6->nSize = 0;
        piVar7 = (int *)malloc(400);
        pVVar6->pArray = piVar7;
        if (1 < pVVar1[uVar9].nSize) {
          lVar11 = 1;
          do {
            iVar2 = Smt_PrsBuildNode(pNtk,p,pVVar1[uVar9].pArray[lVar11],-1,(char *)0x0);
            if (iVar2 == 0) {
              if (pVVar6->pArray != (int *)0x0) {
                free(pVVar6->pArray);
              }
              free(pVVar6);
              return 0;
            }
            Vec_IntPush(pVVar6,iVar2);
            lVar11 = lVar11 + 1;
          } while (lVar11 < pVVar1[uVar9].nSize);
        }
        iVar2 = (int)local_48;
        uVar9 = iVar2 - 0x17;
        if (0xfffffffd < uVar9) {
          __assert_fail("Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                        ,0x198,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        if (iVar2 == 0x13) {
          if ((((int)uVar3 < 0) || ((int)local_58 < 0)) ||
             (iVar13 = uVar3 - local_58, (int)uVar3 < (int)local_58)) {
            __assert_fail("Value1 >= 0 && Value2 >= 0 && Value1 >= Value2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                          ,0x19b,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
          Vec_IntPush(pVVar6,uVar3 << 0x10 | local_58);
LAB_002fc478:
          iVar13 = iVar13 + 1;
LAB_002fc47b:
          if (iVar13 < 1) {
LAB_002fc62a:
            __assert_fail("Range > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                          ,0x1bf,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
        }
        else {
          if (iVar2 - 0xdU < 2) {
            if ((int)uVar3 < 0) {
              __assert_fail("Value1 >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                            ,0x1a1,
                            "int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
            }
            sprintf((char *)local_3c,"%d",(ulong)uVar3);
            iVar2 = Smt_PrsBuildConstant(pNtk,(char *)local_3c,-1,(char *)0x0);
            Vec_IntPush(pVVar6,iVar2);
            iVar2 = (int)local_48;
          }
          iVar13 = 1;
          if (0xc < uVar9) {
            uVar9 = pVVar6->nSize;
            if (iVar2 == 8) {
              if (uVar9 != 3) {
                __assert_fail("Vec_IntSize(vFanins) == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                              ,0x1b4,
                              "int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
              }
              piVar7 = pVVar6->pArray;
              iVar13 = piVar7[1];
              Id = piVar7[2];
              piVar7[1] = Id;
              piVar7[2] = iVar13;
LAB_002fc468:
              pWVar8 = Wlc_NtkObj(pNtk,Id);
              iVar13 = pWVar8->End - pWVar8->Beg;
              goto LAB_002fc478;
            }
            if (iVar2 == 0x14) {
              if ((int)uVar9 < 1) goto LAB_002fc62a;
              uVar10 = 0;
              iVar13 = 0;
              do {
                lVar11 = (long)pVVar6->pArray[uVar10];
                if ((lVar11 < 1) || (pNtk->nObjsAlloc <= pVVar6->pArray[uVar10])) {
                  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                                ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
                }
                iVar13 = ((iVar13 + pNtk->pObjs[lVar11].End) - pNtk->pObjs[lVar11].Beg) + 1;
                uVar10 = uVar10 + 1;
              } while (uVar9 != uVar10);
              goto LAB_002fc47b;
            }
            if (0 < (int)uVar9) {
              Id = *pVVar6->pArray;
              goto LAB_002fc468;
            }
LAB_002fc532:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
        }
        iVar2 = Smt_PrsCreateNode(pNtk,iVar2,local_54,iVar13,pVVar6,local_50);
        if (pVVar6->pArray != (int *)0x0) {
          free(pVVar6->pArray);
        }
LAB_002fc4b0:
        free(pVVar6);
        return iVar2;
      }
      pcVar4 = Abc_NamStr(p->pStrs,uVar12 >> 1);
      if ((pcVar5 == (char *)0x0) || (pcVar4 == (char *)0x0)) {
        iVar2 = pVVar1[uVar9].nSize;
        if (pcVar5 != (char *)0x0) goto LAB_002fbfc5;
LAB_002fc0a5:
        if (0 < iVar2) goto LAB_002fc0ad;
        goto LAB_002fc532;
      }
      if (((*pcVar5 == '_') && (*pcVar4 == 'b')) && (pcVar4[1] == 'v')) {
        iVar2 = pVVar1[uVar9].nSize;
        if (iVar2 < 3) goto LAB_002fc532;
        uVar12 = pVVar1[uVar9].pArray[2];
        if ((int)uVar12 < 0) goto LAB_002fc513;
        if ((uVar12 & 1) == 0) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
          iVar2 = pVVar1[uVar9].nSize;
        }
        if (iVar2 != 3) {
          __assert_fail("Vec_IntSize(vFans) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                        ,0x169,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        pcVar4 = pcVar5 + 2;
        RangeOut = atoi(pcVar5);
        goto LAB_002fc066;
      }
      iVar2 = pVVar1[uVar9].nSize;
LAB_002fbfc5:
      if (*pcVar5 != '=') goto LAB_002fc0a5;
      if (iVar2 != 3) {
        __assert_fail("Vec_IntSize(vFans) == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                      ,0x16e,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      uVar12 = pVVar1[uVar9].pArray[2];
      if ((int)uVar12 < 0) goto LAB_002fc513;
      if ((uVar12 & 1) == 0) {
        __assert_fail("Smt_EntryIsName(iNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                      ,0x170,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      pcVar5 = Abc_NamStr(p->pStrs,uVar12 >> 1);
      iVar2 = strcmp("#b1",pcVar5);
      if (iVar2 != 0) {
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 0x10;
        pVVar6->nSize = 0;
        piVar7 = (int *)malloc(0x40);
        pVVar6->pArray = piVar7;
        iVar2 = Smt_PrsBuildConstant(pNtk,pcVar5,-1,(char *)0x0);
        pcVar5 = local_50;
        if (pVVar1[uVar9].nSize < 2) goto LAB_002fc532;
        iVar13 = Smt_PrsBuildNode(pNtk,p,pVVar1[uVar9].pArray[1],-1,local_50);
        Vec_IntPush(pVVar6,iVar13);
        Vec_IntPush(pVVar6,iVar2);
        iVar2 = Smt_PrsCreateNode(pNtk,0x1b,0,1,pVVar6,pcVar5);
        if (pVVar6->pArray != (int *)0x0) {
          free(pVVar6->pArray);
        }
        goto LAB_002fc4b0;
      }
      if (pVVar1[uVar9].nSize < 2) goto LAB_002fc532;
      iNode = pVVar1[uVar9].pArray[1];
      if (iNode < 0) goto LAB_002fc513;
    } while ((iNode & 1U) == 0);
    RangeOut = -1;
  }
  pcVar4 = Abc_NamStr(p->pStrs,(uint)iNode >> 1);
  if (*pcVar4 != '#' && 9 < (byte)(*pcVar4 - 0x30U)) {
    iVar2 = Abc_NamStrFindOrAdd(pNtk->pManName,pcVar4,local_3c);
    if (local_3c[0] != 0) {
      return iVar2;
    }
    __assert_fail("fFound",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x15c,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
  }
LAB_002fc066:
  iVar2 = Smt_PrsBuildConstant(pNtk,pcVar4,RangeOut,local_50);
  return iVar2;
}

Assistant:

int Smt_PrsBuildNode( Wlc_Ntk_t * pNtk, Smt_Prs_t * p, int iNode, int RangeOut, char * pName )
{
    if ( Smt_EntryIsName(iNode) ) // name or constant
    {
        char * pStr = Abc_NamStr(p->pStrs, Abc_Lit2Var(iNode));
        if ( (pStr[0] >= '0' && pStr[0] <= '9') || pStr[0] == '#' )
        { 
            // (_ BitVec 8) #x19
            return Smt_PrsBuildConstant( pNtk, pStr, RangeOut, pName );
        }
        else
        {
            // s3087
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            return iObj;
        }
    }
    else // node
    {
        Vec_Int_t * vFans = Smt_EntryNode( p, iNode );
        char * pStr0 = Smt_VecEntryName( p, vFans, 0 );
        char * pStr1 = Smt_VecEntryName( p, vFans, 1 );
        if ( pStr0 && pStr1 && pStr0[0] == '_' && pStr1[0] == 'b' && pStr1[1] == 'v' )
        {
            // (_ bv1 32)
            char * pStr2 = Smt_VecEntryName( p, vFans, 2 );
            assert( Vec_IntSize(vFans) == 3 );
            return Smt_PrsBuildConstant( pNtk, pStr2+2, atoi(pStr2), pName );
        }
        else if ( pStr0 && pStr0[0] == '=' )
        {
            assert( Vec_IntSize(vFans) == 3 );
            iNode = Vec_IntEntry(vFans, 2);
            assert( Smt_EntryIsName(iNode) );
            pStr0 = Smt_EntryName(p, iNode);
            // check the last one is "#b1"
            if ( !strcmp("#b1", pStr0) )
            {
                iNode = Vec_IntEntry(vFans, 1);
                return Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
            }
            else
            {
                Vec_Int_t * vFanins = Vec_IntAlloc( 2 );
                // get the constant
                int iObj, iOper, iConst = Smt_PrsBuildConstant( pNtk, pStr0, -1, NULL );
                // check the middle one is an operator
                iNode = Vec_IntEntry(vFans, 1);
                iOper = Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
                // build comparator
                Vec_IntPushTwo( vFanins, iOper, iConst );
                iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_COMP_EQU, 0, 1, vFanins, pName );
                Vec_IntFree( vFanins );
                return iObj;
            }
        }
        else
        {
            int i, Fan, NameId, iFanin, fSigned, Range, Value1 = -1, Value2 = -1;
            int Type = Smt_PrsReadType( p, Vec_IntEntry(vFans, 0), &fSigned, &Value1, &Value2 );
            // collect fanins
            Vec_Int_t * vFanins = Vec_IntAlloc( 100 );
            Vec_IntForEachEntryStart( vFans, Fan, i, 1 )
            {
                iFanin = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
                if ( iFanin == 0 )
                {
                    Vec_IntFree( vFanins );
                    return 0;
                }
                Vec_IntPush( vFanins, iFanin );
            }
            // update specialized nodes
            assert( Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD );
            if ( Type == WLC_OBJ_BIT_SELECT )
            {
                assert( Value1 >= 0 && Value2 >= 0 && Value1 >= Value2 );
                Vec_IntPush( vFanins, (Value1 << 16) | Value2 );
            }
            else if ( Type == WLC_OBJ_ROTATE_R || Type == WLC_OBJ_ROTATE_L )
            {
                char Buffer[10];
                assert( Value1 >= 0 );
                sprintf( Buffer, "%d", Value1 ); 
                NameId = Smt_PrsBuildConstant( pNtk, Buffer, -1, NULL );
                Vec_IntPush( vFanins, NameId );
            }
            // find range
            Range = 0;
            if ( Type >= WLC_OBJ_LOGIC_NOT && Type <= WLC_OBJ_REDUCT_XOR )
                Range = 1;
            else if ( Type == WLC_OBJ_BIT_SELECT )
                Range = Value1 - Value2 + 1;
            else if ( Type == WLC_OBJ_BIT_CONCAT )
            {
                Vec_IntForEachEntry( vFanins, NameId, i )
                    Range += Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else if ( Type == WLC_OBJ_MUX )
            {
                int * pArray = Vec_IntArray(vFanins);
                assert( Vec_IntSize(vFanins) == 3 );
                ABC_SWAP( int, pArray[1], pArray[2] );
                NameId = Vec_IntEntry(vFanins, 1);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else // to determine range, look at the first argument
            {
                NameId = Vec_IntEntry(vFanins, 0);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            // create node
            assert( Range > 0 );
            NameId = Smt_PrsCreateNode( pNtk, Type, fSigned, Range, vFanins, pName );
            Vec_IntFree( vFanins );
            return NameId;
        }
    }
}